

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void Map_Destroy(MAP_HANDLE handle)

{
  ulong local_20;
  size_t i;
  MAP_HANDLE_DATA *handleData;
  MAP_HANDLE handle_local;
  
  if (handle != (MAP_HANDLE)0x0) {
    for (local_20 = 0; local_20 < handle->count; local_20 = local_20 + 1) {
      free(handle->keys[local_20]);
      free(handle->values[local_20]);
    }
    free(handle->keys);
    free(handle->values);
    free(handle);
  }
  return;
}

Assistant:

void Map_Destroy(MAP_HANDLE handle)
{
    /*Codes_SRS_MAP_02_005: [If parameter handle is NULL then Map_Destroy shall take no action.] */
    if (handle != NULL)
    {
        /*Codes_SRS_MAP_02_004: [Map_Destroy shall release all resources associated with the map.] */
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;
        size_t i;

        for (i = 0; i < handleData->count; i++)
        {
            free(handleData->keys[i]);
            free(handleData->values[i]);
        }
        free(handleData->keys);
        free(handleData->values);
        free(handleData);
    }
}